

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.inc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::cpp_unittest::HelpersTest_TestSCC_Test::~HelpersTest_TestSCC_Test
          (HelpersTest_TestSCC_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(HELPERS_TEST_NAME, TestSCC) {
  UNITTEST::TestMutualRecursionA a;
  MessageSCCAnalyzer scc_analyzer((Options()));
  const SCC* scc = scc_analyzer.GetSCC(a.GetDescriptor());
  std::vector<absl::string_view> names;
  names.reserve(scc->descriptors.size());
  for (int i = 0; i < scc->descriptors.size(); i++) {
    names.push_back(scc->descriptors[i]->full_name());
  }
  const absl::string_view package = a.GetDescriptor()->file()->package();
  EXPECT_THAT(names,
              UnorderedElementsAre(
                  absl::StrCat(package, ".TestMutualRecursionA"),
                  absl::StrCat(package, ".TestMutualRecursionA.SubGroup"),
                  absl::StrCat(package, ".TestMutualRecursionA.SubMessage"),
                  absl::StrCat(package, ".TestMutualRecursionB")));

  MessageAnalysis result = scc_analyzer.GetSCCAnalysis(scc);
  EXPECT_EQ(result.is_recursive, true);
  EXPECT_EQ(result.contains_required, false);
  EXPECT_EQ(result.contains_cord, true);  // TestAllTypes
  EXPECT_EQ(result.contains_extension, false);  // TestAllTypes
}